

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

char * JS_AtomToCString(JSContext *ctx,JSAtom atom)

{
  int iVar1;
  char *pcVar2;
  JSRefCountHeader *p;
  JSValue val1;
  
  val1 = __JS_AtomToValue(ctx,atom,1);
  if ((uint)val1.tag == 6) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = JS_ToCStringLen2(ctx,(size_t *)0x0,val1,0);
    if ((0xfffffff4 < (uint)val1.tag) &&
       (iVar1 = *val1.u.ptr, *(int *)val1.u.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,val1);
    }
  }
  return pcVar2;
}

Assistant:

const char *JS_AtomToCString(JSContext *ctx, JSAtom atom)
{
    JSValue str;
    const char *cstr;

    str = JS_AtomToString(ctx, atom);
    if (JS_IsException(str))
        return NULL;
    cstr = JS_ToCString(ctx, str);
    JS_FreeValue(ctx, str);
    return cstr;
}